

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_file_sink-inl.h
# Opt level: O1

void __thiscall
spdlog::sinks::basic_file_sink<spdlog::details::null_mutex>::sink_it_
          (basic_file_sink<spdlog::details::null_mutex> *this,log_msg *msg)

{
  formatter *pfVar1;
  size_t in_RCX;
  void *__buf;
  undefined **local_130;
  undefined1 *local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined1 local_110 [256];
  
  uStack_120 = 0;
  local_130 = &PTR_grow_001b3058;
  local_118 = 0xfa;
  pfVar1 = (this->super_base_sink<spdlog::details::null_mutex>).formatter_._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  local_128 = local_110;
  (*pfVar1->_vptr_formatter[2])(pfVar1,msg,&local_130);
  details::file_helper::write(&this->file_helper_,(int)&local_130,__buf,in_RCX);
  if (local_128 != local_110) {
    operator_delete(local_128);
  }
  return;
}

Assistant:

SPDLOG_INLINE void basic_file_sink<Mutex>::sink_it_(const details::log_msg &msg) {
    memory_buf_t formatted;
    base_sink<Mutex>::formatter_->format(msg, formatted);
    file_helper_.write(formatted);
}